

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 *pos,ImU32 col,ImWchar c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  ImFontGlyph *pIVar6;
  uint col_00;
  float fVar7;
  float fVar8;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar6 = FindGlyph(this,c);
  if ((pIVar6 != (ImFontGlyph *)0x0) &&
     (((undefined1  [40])*pIVar6 & (undefined1  [40])0x2) != (undefined1  [40])0x0)) {
    col_00 = col | 0xffffff;
    if (((undefined1  [40])*pIVar6 & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
      col_00 = col;
    }
    fVar5 = (float)(-(uint)(size < 0.0) & 0x3f800000 |
                   ~-(uint)(size < 0.0) & (uint)(size / this->FontSize));
    fVar7 = (float)(int)(*pos).x;
    fVar8 = (float)(int)(*pos).y;
    ImDrawList::PrimReserve(draw_list,6,4);
    uVar1 = pIVar6->X0;
    uVar3 = pIVar6->Y0;
    local_38.y = (float)uVar3 * fVar5 + fVar8;
    local_38.x = (float)uVar1 * fVar5 + fVar7;
    uVar2 = pIVar6->X1;
    uVar4 = pIVar6->Y1;
    local_40.y = (float)uVar4 * fVar5 + fVar8;
    local_40.x = (float)uVar2 * fVar5 + fVar7;
    local_48.x = pIVar6->U0;
    local_48.y = pIVar6->V0;
    local_50.x = pIVar6->U1;
    local_50.y = pIVar6->V1;
    ImDrawList::PrimRectUV(draw_list,&local_38,&local_40,&local_48,&local_50,col_00);
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, const ImVec2& pos, ImU32 col, ImWchar c) const
{
    const ImFontGlyph* glyph = FindGlyph(c);
    if (!glyph || !glyph->Visible)
        return;
    if (glyph->Colored)
        col |= ~IM_COL32_A_MASK;
    float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
    float x = IM_FLOOR(pos.x);
    float y = IM_FLOOR(pos.y);
    draw_list->PrimReserve(6, 4);
    draw_list->PrimRectUV(ImVec2(x + glyph->X0 * scale, y + glyph->Y0 * scale), ImVec2(x + glyph->X1 * scale, y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
}